

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hacl_HMAC_SHA2_256.c
# Opt level: O1

void Hacl_Impl_SHA2_256_update_last(uint32_t *state,uint8_t *data,uint32_t len)

{
  ulong uVar1;
  long lVar2;
  uint8_t *data_00;
  ulong __n;
  uint8_t blocks [128];
  uint8_t local_a8;
  undefined1 auStack_a7 [15];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_38 = 0;
  uStack_30 = 0;
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  _local_a8 = 0;
  auStack_a7._7_8_ = 0;
  lVar2 = 2 - (ulong)(len < 0x38);
  data_00 = &local_a8 + (ulong)(len < 0x38) * 0x40;
  __n = (ulong)len;
  memcpy(data_00,data,__n);
  uVar1 = (ulong)state[0x88] * 0x200 + __n * 8;
  data_00[__n] = 0x80;
  *(ulong *)(data_00 + (ulong)(0x37 - len & 0x3f) + 1 + __n) =
       (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 | (uVar1 & 0xff000000) << 8 |
       (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 | __n << 0x3b;
  do {
    Hacl_Impl_SHA2_256_update(state,data_00);
    data_00 = data_00 + 0x40;
    lVar2 = lVar2 + -1;
  } while (lVar2 != 0);
  return;
}

Assistant:

static void Hacl_Impl_SHA2_256_update_last(uint32_t *state, uint8_t *data, uint32_t len)
{
  uint8_t blocks[128U] = { 0U };
  uint32_t nb;
  if (len < (uint32_t)56U)
    nb = (uint32_t)1U;
  else
    nb = (uint32_t)2U;
  uint8_t *final_blocks;
  if (len < (uint32_t)56U)
    final_blocks = blocks + (uint32_t)64U;
  else
    final_blocks = blocks;
  memcpy(final_blocks, data, len * sizeof data[0U]);
  uint32_t n1 = state[136U];
  uint8_t *padding = final_blocks + len;
  uint32_t
  pad0len = ((uint32_t)64U - (len + (uint32_t)8U + (uint32_t)1U) % (uint32_t)64U) % (uint32_t)64U;
  uint8_t *buf1 = padding;
  uint8_t *buf2 = padding + (uint32_t)1U + pad0len;
  uint64_t
  encodedlen = ((uint64_t)n1 * (uint64_t)(uint32_t)64U + (uint64_t)len) * (uint64_t)(uint32_t)8U;
  buf1[0U] = (uint8_t)0x80U;
  store64_be(buf2, encodedlen);
  Hacl_Impl_SHA2_256_update_multi(state, final_blocks, nb);
}